

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O2

int eaten_stat(int base,obj *obj)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  unsigned_short *puVar5;
  ulong uVar6;
  
  uVar1 = obj->oeaten;
  if ((long)obj->otyp == 0x10e) {
    puVar5 = &mons[obj->corpsenm].cnutrit;
  }
  else {
    puVar5 = &objects[obj->otyp].oc_nutrition;
  }
  uVar6 = (ulong)*puVar5;
  uVar3 = (ulong)uVar1;
  if (*puVar5 < uVar1) {
    warning("partly eaten food (%ld) more nutritious than untouched food (%ld)",(ulong)uVar1,uVar6);
    uVar3 = uVar6;
  }
  if (uVar6 == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = (int)((long)(uVar3 * (long)base) / (long)uVar6);
  }
  iVar4 = 1;
  if (1 < iVar2) {
    iVar4 = iVar2;
  }
  return iVar4;
}

Assistant:

int eaten_stat(int base, struct obj *obj)
{
	long uneaten_amt, full_amount;

	uneaten_amt = (long)obj->oeaten;
	full_amount = (obj->otyp == CORPSE) ? (long)mons[obj->corpsenm].cnutrit
					: (long)objects[obj->otyp].oc_nutrition;
	if (uneaten_amt > full_amount) {
	    warning(
	  "partly eaten food (%ld) more nutritious than untouched food (%ld)",
		       uneaten_amt, full_amount);
	    uneaten_amt = full_amount;
	}

	base = (int)(full_amount ? (long)base * uneaten_amt / full_amount : 0L);
	return (base < 1) ? 1 : base;
}